

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_true>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  ulong uVar1;
  Scalar *pSVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Packet2d mask;
  
  uVar1 = (mat->m_xpr->
          super_BlockImpl<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
          .m_blockRows.m_value;
  uVar3 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar3 = uVar1;
  }
  pSVar2 = (mat->m_evaluator).
           super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
           .
           super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
           .m_argImpl.
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           .
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
           .m_argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
           m_data + (mat->m_evaluator).
                    super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
                    .
                    super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
                    .m_linear_offset.m_value;
  if (uVar1 + 1 < 3) {
    dVar6 = ABS(*pSVar2);
    if (1 < (long)uVar1) {
      uVar3 = 1;
      do {
        dVar6 = dVar6 + ABS(pSVar2[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else {
    uVar4 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
    dVar9 = ABS(*pSVar2);
    dVar6 = ABS(pSVar2[1]);
    if (3 < (long)uVar1) {
      uVar3 = uVar3 & 0xfffffffffffffffc;
      dVar7 = ABS(pSVar2[2]);
      dVar8 = ABS(pSVar2[3]);
      if (7 < (long)uVar1) {
        lVar5 = 4;
        do {
          dVar9 = dVar9 + ABS(pSVar2[lVar5]);
          dVar6 = dVar6 + ABS((pSVar2 + lVar5)[1]);
          dVar7 = dVar7 + ABS(pSVar2[lVar5 + 2]);
          dVar8 = dVar8 + ABS((pSVar2 + lVar5 + 2)[1]);
          lVar5 = lVar5 + 4;
        } while (lVar5 < (long)uVar3);
      }
      dVar9 = dVar7 + dVar9;
      dVar6 = dVar8 + dVar6;
      if ((long)uVar3 < (long)uVar4) {
        dVar9 = dVar9 + ABS(pSVar2[uVar3]);
        dVar6 = dVar6 + ABS((pSVar2 + uVar3)[1]);
      }
    }
    dVar6 = dVar6 + dVar9;
    if ((long)uVar4 < (long)uVar1) {
      do {
        dVar6 = dVar6 + ABS(pSVar2[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return dVar6;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }